

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[6],pstack::Dwarf::Units,char>
          (JObject *this,char (*k) [6],Units *v,char *c)

{
  ostream *os;
  undefined1 local_40 [8];
  Field<char[6],_pstack::Dwarf::Units> field;
  
  local_40 = (undefined1  [8])k;
  field.k = (char (*) [6])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (Units *)local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[6],_pstack::Dwarf::Units>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }